

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_rgb_f(float r,float g,float b)

{
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float b_local;
  float g_local;
  float r_local;
  nk_color ret;
  
  local_1c = r;
  if (1.0 < r) {
    local_1c = 1.0;
  }
  if (local_1c <= 0.0) {
    local_24 = 0.0;
  }
  else {
    local_20 = r;
    if (1.0 < r) {
      local_20 = 1.0;
    }
    local_24 = local_20;
  }
  local_28 = g;
  if (1.0 < g) {
    local_28 = 1.0;
  }
  if (local_28 <= 0.0) {
    local_30 = 0.0;
  }
  else {
    local_2c = g;
    if (1.0 < g) {
      local_2c = 1.0;
    }
    local_30 = local_2c;
  }
  local_34 = b;
  if (1.0 < b) {
    local_34 = 1.0;
  }
  if (local_34 <= 0.0) {
    local_3c = 0.0;
  }
  else {
    local_38 = b;
    if (1.0 < b) {
      local_38 = 1.0;
    }
    local_3c = local_38;
  }
  g_local = (float)CONCAT13(0xff,CONCAT12((char)(int)(local_3c * 255.0),
                                          CONCAT11((char)(int)(local_30 * 255.0),
                                                   (char)(int)(local_24 * 255.0))));
  return (nk_color)g_local;
}

Assistant:

NK_API struct nk_color
nk_rgb_f(float r, float g, float b)
{
    struct nk_color ret;
    ret.r = (nk_byte)(NK_SATURATE(r) * 255.0f);
    ret.g = (nk_byte)(NK_SATURATE(g) * 255.0f);
    ret.b = (nk_byte)(NK_SATURATE(b) * 255.0f);
    ret.a = 255;
    return ret;
}